

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  bool bVar6;
  ImGuiID IVar7;
  ImGuiItemStatusFlags IVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 frame_padding_local;
  ImVec2 label_size;
  ImVec2 local_80;
  ImVec2 local_78;
  ImDrawList *local_70;
  char *local_68;
  ImVec2 local_60;
  ImVec2 unsaved_marker_pos;
  
  pIVar9 = GImGui;
  frame_padding_local = frame_padding;
  local_70 = draw_list;
  local_68 = label;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar13 = (bb->Min).x;
  fVar12 = (bb->Max).x;
  if (1.0 < fVar12 - fVar13) {
    fVar13 = fVar13 + frame_padding_local.x;
    fVar1 = (bb->Max).y;
    fVar14 = (bb->Min).y + frame_padding_local.y;
    fVar12 = fVar12 - frame_padding_local.x;
    if ((flags & 1U) != 0) {
      IVar3 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar12 = fVar12 - IVar3.x;
      unsaved_marker_pos.x = (bb->Min).x + frame_padding_local.x + label_size.x + 2.0;
      if (fVar12 <= unsaved_marker_pos.x) {
        unsaved_marker_pos.x = fVar12;
      }
      unsaved_marker_pos.y =
           (float)(int)(pIVar9->FontSize * -0.25) + (bb->Min).y + frame_padding_local.y;
      local_80.y = (bb->Max).y - frame_padding_local.y;
      local_80.x = (bb->Max).x - frame_padding_local.x;
      local_60.x = 0.0;
      local_60.y = 0.0;
      RenderTextClippedEx(local_70,&unsaved_marker_pos,&local_80,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_60,(ImRect *)0x0);
    }
    local_80.y = fVar14;
    local_80.x = fVar13;
    if (out_text_clipped != (bool *)0x0) {
      *out_text_clipped = fVar12 < fVar13 + label_size.x;
    }
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         ((bb->Max).x - (bb->Min).x < (pIVar9->Style).TabMinWidthForCloseButton)))) ||
       ((pIVar9->HoveredId != close_button_id && pIVar9->HoveredId != tab_id &&
        (pIVar9->ActiveId != tab_id && pIVar9->ActiveId != close_button_id)))) {
      bVar6 = false;
    }
    else {
      bVar6 = true;
    }
    local_78.x = fVar12;
    local_78.y = fVar1;
    if (bVar6) {
      pIVar2 = GImGui->CurrentWindow;
      IVar7 = (pIVar2->DC).LastItemId;
      IVar8 = (pIVar2->DC).LastItemStatusFlags;
      unsaved_marker_pos = (pIVar2->DC).LastItemRect.Min;
      IVar3 = (pIVar2->DC).LastItemRect.Max;
      IVar4 = (pIVar2->DC).LastItemDisplayRect.Min;
      IVar5 = (pIVar2->DC).LastItemDisplayRect.Max;
      fVar13 = pIVar9->FontSize;
      PushStyleVar(10,&frame_padding_local);
      local_60.y = (bb->Min).y;
      local_60.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar13;
      bVar10 = CloseButton(close_button_id,&local_60);
      PopStyleVar(1);
      pIVar2 = GImGui->CurrentWindow;
      (pIVar2->DC).LastItemId = IVar7;
      (pIVar2->DC).LastItemStatusFlags = IVar8;
      (pIVar2->DC).LastItemRect.Min = unsaved_marker_pos;
      (pIVar2->DC).LastItemRect.Max = IVar3;
      (pIVar2->DC).LastItemDisplayRect.Min = IVar4;
      (pIVar2->DC).LastItemDisplayRect.Max = IVar5;
      if ((flags & 4U) == 0) {
        bVar11 = IsMouseClicked(2,false);
        if (bVar11) {
          bVar10 = true;
        }
      }
      fVar12 = fVar12 - fVar13;
    }
    else {
      bVar10 = false;
    }
    fVar13 = fVar12;
    if (!bVar6) {
      fVar13 = (bb->Max).x + -1.0;
    }
    RenderTextEllipsis(local_70,&local_80,&local_78,fVar12,fVar13,local_68,(char *)0x0,&label_size);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = bVar10;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiLastItemDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}